

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

void __thiscall MPL::detail::ModelPackageImpl::validate(ModelPackageImpl *this)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  pointer pJVar4;
  istream *piVar5;
  size_type sVar6;
  runtime_error *prVar7;
  reference pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  string local_490;
  path local_470;
  undefined1 local_448 [8];
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  byte local_3f3;
  byte local_3f2;
  allocator<char> local_3f1;
  string local_3f0;
  byte local_3cb;
  byte local_3ca;
  allocator<char> local_3c9;
  string local_3c8;
  byte local_3a3;
  byte local_3a2;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *identifier;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [4];
  invalid_argument *e;
  int patchVersion;
  int minorVersion;
  int majorVersion;
  undefined1 local_220 [8];
  string token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  versionTokens;
  istringstream versionStringStream;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string versionString;
  ModelPackageImpl *this_local;
  
  versionString.field_2._8_8_ = this;
  pJVar4 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->(&this->m_manifest);
  pcVar1 = kModelPackageFileFormatVersionKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
  JsonMap::getString((string *)local_30,pJVar4,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)
             &versionTokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_30,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&token.field_2 + 8));
  std::__cxx11::string::string((string *)local_220);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)
                        &versionTokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_220,'.')
    ;
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&token.field_2 + 8),(value_type *)local_220);
  }
  std::__cxx11::string::~string((string *)local_220);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&token.field_2 + 8));
  if (sVar6 != 3) {
    minorVersion._3_1_ = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &majorVersion,
                   "File format version must be in the form of major.minor.patch, but the specified value was: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::runtime_error::runtime_error(prVar7,(string *)&majorVersion);
    minorVersion._3_1_ = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  patchVersion = 0;
  e._4_4_ = 0;
  e._0_4_ = 0;
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&token.field_2 + 8),0);
  patchVersion = std::__cxx11::stoi(pvVar8,(size_t *)0x0,10);
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&token.field_2 + 8),1);
  e._4_4_ = std::__cxx11::stoi(pvVar8,(size_t *)0x0,10);
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&token.field_2 + 8),2);
  e._0_4_ = std::__cxx11::stoi(pvVar8,(size_t *)0x0,10);
  if (((patchVersion < 0) || (e._4_4_ < 0)) || ((int)e < 0)) {
    local_2e1 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_2e0,"File format version uses negative number(s): ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::runtime_error::runtime_error(prVar7,(string *)local_2e0);
    local_2e1 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((patchVersion < 2) && ((patchVersion != 1 || (e._4_4_ < 1)))) &&
     ((e._4_4_ != 0 || ((int)e < 1)))) {
    getItemInfoEntries((ModelPackageImpl *)
                       &identifiers.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)
                            &identifiers.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
      pJVar4 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                         ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)
                          &identifiers.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      JsonMap::getKeys(pJVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range2);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      identifier = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&identifier), bVar2) {
        itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
        super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
        super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl =
             (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        getItemInfoEntry((ModelPackageImpl *)local_358,(string *)this);
        pJVar4 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                           ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_358);
        pcVar1 = kModelPackageItemInfoPathKey;
        std::allocator<char>::allocator();
        local_3a2 = 0;
        local_3a3 = 0;
        local_3ca = 0;
        local_3cb = 0;
        local_3f2 = 0;
        local_3f3 = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,pcVar1,&local_379);
        bVar3 = JsonMap::hasKey(pJVar4,&local_378);
        bVar2 = true;
        if (bVar3) {
          pJVar4 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                             ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_358);
          pcVar1 = kModelPackageItemInfoNameKey;
          std::allocator<char>::allocator();
          local_3a2 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,pcVar1,&local_3a1)
          ;
          local_3a3 = 1;
          bVar3 = JsonMap::hasKey(pJVar4,&local_3a0);
          bVar2 = true;
          if (bVar3) {
            pJVar4 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                               ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_358);
            pcVar1 = kModelPackageItemInfoAuthorKey;
            std::allocator<char>::allocator();
            local_3ca = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3c8,pcVar1,&local_3c9);
            local_3cb = 1;
            bVar3 = JsonMap::hasKey(pJVar4,&local_3c8);
            bVar2 = true;
            if (bVar3) {
              pJVar4 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                                 ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_358);
              pcVar1 = kModelPackageItemInfoDescriptionKey;
              std::allocator<char>::allocator();
              local_3f2 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3f0,pcVar1,&local_3f1);
              local_3f3 = 1;
              bVar2 = JsonMap::hasKey(pJVar4,&local_3f0);
              bVar2 = !bVar2;
            }
          }
        }
        if ((local_3f3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_3f0);
        }
        if ((local_3f2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_3f1);
        }
        if ((local_3cb & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_3c8);
        }
        if ((local_3ca & 1) != 0) {
          std::allocator<char>::~allocator(&local_3c9);
        }
        if ((local_3a3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        if ((local_3a2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_3a1);
        }
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator(&local_379);
        if (bVar2) {
          path._39_1_ = 1;
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_418,"Invalid itemInfo for identifier: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         itemInfoEntry._M_t.
                         super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                         super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                         super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl);
          std::runtime_error::runtime_error(prVar7,(string *)&local_418);
          path._39_1_ = 0;
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pJVar4 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                           ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_358);
        pcVar1 = kModelPackageItemInfoPathKey;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,pcVar1,&local_4b1);
        JsonMap::getString(&local_490,pJVar4,&local_4b0);
        std::filesystem::__cxx11::path::path(&local_470,&local_490,auto_format);
        std::filesystem::__cxx11::operator/
                  ((path *)local_448,&this->m_packageDataDirPath,&local_470);
        std::filesystem::__cxx11::path::~path(&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::allocator<char>::~allocator(&local_4b1);
        bVar2 = std::filesystem::exists((path *)local_448);
        if (!bVar2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_4d8,"Item does not exist for identifier: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         itemInfoEntry._M_t.
                         super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                         super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                         super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl);
          std::runtime_error::runtime_error(prVar7,(string *)&local_4d8);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::filesystem::__cxx11::path::~path((path *)local_448);
        std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
                  ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_358);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    }
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)
               &identifiers.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&token.field_2 + 8));
    std::__cxx11::istringstream::~istringstream
              ((istringstream *)
               &versionTokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_30);
    return;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_308,"Unsupported version: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::runtime_error::runtime_error(prVar7,(string *)&local_308);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ModelPackageImpl::validate()
{
    const std::string versionString = m_manifest->getString(kModelPackageFileFormatVersionKey);

    std::istringstream versionStringStream(versionString);
    std::vector<std::string> versionTokens;
    for (std::string token; std::getline(versionStringStream, token, '.');) {
        versionTokens.push_back(token);
    }

    if (versionTokens.size() != 3) {
        throw std::runtime_error("File format version must be in the form of major.minor.patch, but the specified value was: " + versionString);
    }

    int majorVersion = 0;
    int minorVersion = 0;
    int patchVersion = 0;
    try {
        majorVersion = std::stoi(versionTokens[0]);
        minorVersion = std::stoi(versionTokens[1]);
        patchVersion = std::stoi(versionTokens[2]);
    } catch (std::invalid_argument& e) {
        throw std::runtime_error("Failed to parse file format version: " + versionString + " because: " + e.what());
    }

    if (majorVersion < 0 ||
        minorVersion < 0 ||
        patchVersion < 0 ) {
        throw std::runtime_error("File format version uses negative number(s): " + versionString);
    }

    if ((majorVersion > kModelPackageFileFormatMajorVersion) ||
        (majorVersion == kModelPackageFileFormatMajorVersion && minorVersion > kModelPackageFileFormatMinorVersion) ||
        (minorVersion == kModelPackageFileFormatMinorVersion && patchVersion > kModelPackageFileFormatPatchVersion)) {
        throw std::runtime_error("Unsupported version: " + versionString);
    }
    
    // Validate 1.0.0 model package
    
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfoEntry = getItemInfoEntry(identifier);
            
            if (false == itemInfoEntry->hasKey(kModelPackageItemInfoPathKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoNameKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoAuthorKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoDescriptionKey)) {
                throw std::runtime_error("Invalid itemInfo for identifier: " + identifier);
            }
            
            auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
            if (false == exists(path)) {
                throw std::runtime_error("Item does not exist for identifier: " + identifier);
            }
        }
    }
}